

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_method_process.cpp
# Opt level: O0

bool __thiscall sc_core::sc_method_process::trigger_dynamic(sc_method_process *this,sc_event *e)

{
  bool bVar1;
  sc_method_handle psVar2;
  sc_event *in_RSI;
  sc_method_handle in_RDI;
  sc_process_b *unaff_retaddr;
  int in_stack_00000054;
  char *in_stack_00000058;
  char *in_stack_00000060;
  char *in_stack_00000068;
  sc_severity in_stack_00000074;
  sc_method_handle method_h_;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  (in_RDI->super_sc_process_b).m_timed_out = false;
  method_h_ = in_RDI;
  psVar2 = (sc_method_handle)sc_get_current_process_b();
  if (psVar2 == in_RDI) {
    sc_process_b::report_immediate_self_notification(&in_RDI->super_sc_process_b);
    bVar1 = false;
  }
  else {
    bVar1 = sc_process_b::is_runnable(&in_RDI->super_sc_process_b);
    if (bVar1) {
      bVar1 = true;
    }
    else if (((in_RDI->super_sc_process_b).m_state & 1U) == 0) {
      psVar2 = (sc_method_handle)(ulong)(in_RDI->super_sc_process_b).m_trigger_type;
      switch(psVar2) {
      case (sc_method_handle)0x0:
        sc_object::name((sc_object *)0x2abdea);
        sc_report_handler::report
                  (in_stack_00000074,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                   in_stack_00000054);
        return true;
      case (sc_method_handle)0x1:
        (in_RDI->super_sc_process_b).m_event_p = (sc_event *)0x0;
        (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        break;
      case (sc_method_handle)0x2:
        sc_event_list::remove_dynamic
                  ((sc_event_list *)unaff_retaddr,
                   (sc_method_handle)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                   (sc_event *)method_h_);
        sc_event_list::auto_delete((sc_event_list *)method_h_);
        (in_RDI->super_sc_process_b).m_event_list_p = (sc_event_list *)0x0;
        (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        break;
      case (sc_method_handle)0x3:
        (in_RDI->super_sc_process_b).m_event_count = (in_RDI->super_sc_process_b).m_event_count + -1
        ;
        if ((in_RDI->super_sc_process_b).m_event_count != 0) {
          return true;
        }
        sc_event_list::auto_delete((sc_event_list *)method_h_);
        (in_RDI->super_sc_process_b).m_event_list_p = (sc_event_list *)0x0;
        (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        break;
      case (sc_method_handle)0x4:
        (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        break;
      case (sc_method_handle)0x5:
        if (in_RSI == (in_RDI->super_sc_process_b).m_timeout_event_p) {
          (in_RDI->super_sc_process_b).m_timed_out = true;
          sc_event::remove_dynamic
                    ((sc_event *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     method_h_);
          (in_RDI->super_sc_process_b).m_event_p = (sc_event *)0x0;
          (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        }
        else {
          sc_event::cancel((sc_event *)in_RDI);
          sc_event::reset((sc_event *)in_RDI);
          (in_RDI->super_sc_process_b).m_event_p = (sc_event *)0x0;
          (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        }
        break;
      case (sc_method_handle)0x6:
        if (in_RSI == (in_RDI->super_sc_process_b).m_timeout_event_p) {
          (in_RDI->super_sc_process_b).m_timed_out = true;
          sc_event_list::remove_dynamic
                    ((sc_event_list *)unaff_retaddr,
                     (sc_method_handle)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                     ,(sc_event *)method_h_);
          sc_event_list::auto_delete((sc_event_list *)method_h_);
          (in_RDI->super_sc_process_b).m_event_list_p = (sc_event_list *)0x0;
          (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        }
        else {
          sc_event::cancel((sc_event *)in_RDI);
          sc_event::reset((sc_event *)in_RDI);
          sc_event_list::remove_dynamic
                    ((sc_event_list *)unaff_retaddr,
                     (sc_method_handle)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                     ,(sc_event *)method_h_);
          sc_event_list::auto_delete((sc_event_list *)method_h_);
          (in_RDI->super_sc_process_b).m_event_list_p = (sc_event_list *)0x0;
          (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        }
        break;
      case (sc_method_handle)0x7:
        if (in_RSI == (in_RDI->super_sc_process_b).m_timeout_event_p) {
          (in_RDI->super_sc_process_b).m_timed_out = true;
          sc_event_list::remove_dynamic
                    ((sc_event_list *)unaff_retaddr,
                     (sc_method_handle)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                     ,(sc_event *)method_h_);
          sc_event_list::auto_delete((sc_event_list *)method_h_);
          (in_RDI->super_sc_process_b).m_event_list_p = (sc_event_list *)0x0;
          (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        }
        else {
          (in_RDI->super_sc_process_b).m_event_count =
               (in_RDI->super_sc_process_b).m_event_count + -1;
          if ((in_RDI->super_sc_process_b).m_event_count != 0) {
            return true;
          }
          sc_event::cancel((sc_event *)in_RDI);
          sc_event::reset((sc_event *)in_RDI);
          sc_event_list::auto_delete((sc_event_list *)method_h_);
          (in_RDI->super_sc_process_b).m_event_list_p = (sc_event_list *)0x0;
          (in_RDI->super_sc_process_b).m_trigger_type = STATIC;
        }
      }
      if (((in_RDI->super_sc_process_b).m_state & 4U) == 0) {
        sc_object::simcontext((sc_object *)in_RDI);
        sc_simcontext::push_runnable_method((sc_simcontext *)in_RDI,psVar2);
      }
      else {
        (in_RDI->super_sc_process_b).m_state = (in_RDI->super_sc_process_b).m_state | 2;
      }
      bVar1 = true;
    }
    else if (in_RSI == (in_RDI->super_sc_process_b).m_timeout_event_p) {
      sc_process_b::remove_dynamic_events(unaff_retaddr,(bool)in_stack_ffffffffffffffff);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool sc_method_process::trigger_dynamic( sc_event* e )
{
    // No time outs yet, and keep gcc happy.

    m_timed_out = false;

    // Escape cases:
    //   (a) If this method issued the notify() don't schedule it for
    //       execution, but leave the sensitivity in place.
    //   (b) If this method is already runnable can't trigger an event.

#if ! defined( SC_ENABLE_IMMEDIATE_SELF_NOTIFICATIONS )
    if( SC_UNLIKELY_( sc_get_current_process_b() == this ) )
    {
        report_immediate_self_notification();
        return false;
    }
#endif // SC_ENABLE_IMMEDIATE_SELF_NOTIFICATIONS

    if( is_runnable() )
        return true;

    // If a process is disabled then we ignore any events, leaving them enabled:
    //
    // But if this is a time out event we need to remove both it and the
    // event that was being waited for.

    if ( m_state & ps_bit_disabled )
    {
        if ( e == m_timeout_event_p )
	{
	    remove_dynamic_events( true );
	    return true;
	}
	else
	{
	    return false;
	}
    }


    // Process based on the event type and current process state:
    //
    // Every case needs to set 'rc' and continue on to the end of
    // this method to allow suspend processing to work correctly.

    switch( m_trigger_type )
    {
      case EVENT:
	m_event_p = 0;
	m_trigger_type = STATIC;
	break;

      case AND_LIST:
        -- m_event_count;
	if ( m_event_count == 0 )
	{
	    m_event_list_p->auto_delete();
	    m_event_list_p = 0;
	    m_trigger_type = STATIC;
	}
	else
	{
	    return true;
	}
	break;

      case OR_LIST:
	m_event_list_p->remove_dynamic( this, e );
	m_event_list_p->auto_delete();
	m_event_list_p = 0;
	m_trigger_type = STATIC;
	break;

      case TIMEOUT:
	m_trigger_type = STATIC;
	break;

      case EVENT_TIMEOUT:
        if ( e == m_timeout_event_p )
	{
	    m_timed_out = true;
	    m_event_p->remove_dynamic( this );
	    m_event_p = 0;
	    m_trigger_type = STATIC;
	}
	else
	{
	    m_timeout_event_p->cancel();
	    m_timeout_event_p->reset();
	    m_event_p = 0;
	    m_trigger_type = STATIC;
	}
	break;

      case OR_LIST_TIMEOUT:
        if ( e == m_timeout_event_p )
	{
            m_timed_out = true;
            m_event_list_p->remove_dynamic( this, e );
            m_event_list_p->auto_delete();
            m_event_list_p = 0;
            m_trigger_type = STATIC;
	}

	else
	{
            m_timeout_event_p->cancel();
            m_timeout_event_p->reset();
	    m_event_list_p->remove_dynamic( this, e );
	    m_event_list_p->auto_delete();
	    m_event_list_p = 0;
	    m_trigger_type = STATIC;
	}
	break;

      case AND_LIST_TIMEOUT:
        if ( e == m_timeout_event_p )
	{
            m_timed_out = true;
            m_event_list_p->remove_dynamic( this, e );
            m_event_list_p->auto_delete();
            m_event_list_p = 0;
            m_trigger_type = STATIC;
	}

	else
	{
	    -- m_event_count;
	    if ( m_event_count == 0 )
	    {
		m_timeout_event_p->cancel();
		m_timeout_event_p->reset();
		// no need to remove_dynamic
		m_event_list_p->auto_delete();
		m_event_list_p = 0;
		m_trigger_type = STATIC;
	    }
	    else
	    {
	        return true;
	    }
	}
	break;

      case STATIC: {
        // we should never get here, but throw_it() can make it happen.
	SC_REPORT_WARNING(SC_ID_NOT_EXPECTING_DYNAMIC_EVENT_NOTIFY_, name());
        return true;
      }
    }

    // If we get here then the method has satisfied its next_trigger, if its
    // suspended mark its state as ready to run. If its not suspended then push
    // it onto the runnable queue.

    if ( (m_state & ps_bit_suspended) )
    {
	m_state = m_state | ps_bit_ready_to_run;
    }
    else
    {
        simcontext()->push_runnable_method(this);
    }

    return true;
}